

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_bit.c
# Opt level: O2

int bit_result64(lua_State *L,CTypeID id,uint64_t x)

{
  long *plVar1;
  TValue *pTVar2;
  void *pvVar3;
  
  pvVar3 = lj_mem_newgco(L,0x10);
  *(undefined1 *)((long)pvVar3 + 5) = 10;
  *(short *)((long)pvVar3 + 6) = (short)id;
  plVar1 = (long *)((ulong)(L->glref).ptr32 + 0xe0);
  *plVar1 = *plVar1 + 1;
  *(uint64_t *)((long)pvVar3 + 8) = x;
  pTVar2 = L->base;
  pTVar2[-1].u32.lo = (uint32_t)pvVar3;
  *(undefined4 *)((long)pTVar2 + -4) = 0xfffffff5;
  return (uint32_t)pvVar3;
}

Assistant:

static int bit_result64(lua_State *L, CTypeID id, uint64_t x)
{
  GCcdata *cd = lj_cdata_new_(L, id, 8);
  *(uint64_t *)cdataptr(cd) = x;
  setcdataV(L, L->base-1-LJ_FR2, cd);
  return FFH_RES(1);
}